

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int io_lines(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  char *pcVar3;
  FILE **ppFVar4;
  FILE *pFVar5;
  char *__modes;
  char *filename;
  int idx;
  
  pTVar1 = L->base;
  if (((pTVar1 == &luaO_nilobject_) || (L->top <= pTVar1)) || (pTVar1->tt < 1)) {
    lua_rawgeti(L,-0x2711,1);
    tofile(L);
    idx = 1;
    iVar2 = 0;
  }
  else {
    pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
    ppFVar4 = newfile(L);
    pFVar5 = fopen64(pcVar3,"r");
    *ppFVar4 = (FILE *)pFVar5;
    if (pFVar5 == (FILE *)0x0) {
      fileerror(L,(int)pcVar3,filename);
      pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
      __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
      ppFVar4 = newfile(L);
      pFVar5 = fopen64(pcVar3,__modes);
      *ppFVar4 = (FILE *)pFVar5;
      if (pFVar5 != (FILE *)0x0) {
        return 1;
      }
      iVar2 = pushresult(L,0,pcVar3);
      return iVar2;
    }
    idx = (int)((ulong)((long)L->top - (long)L->base) >> 4);
    iVar2 = 1;
  }
  aux_lines(L,idx,iVar2);
  return 1;
}

Assistant:

static int io_lines(lua_State*L){
if(lua_isnoneornil(L,1)){
lua_rawgeti(L,(-10001),1);
return f_lines(L);
}
else{
const char*filename=luaL_checkstring(L,1);
FILE**pf=newfile(L);
*pf=fopen(filename,"r");
if(*pf==NULL)
fileerror(L,1,filename);
aux_lines(L,lua_gettop(L),1);
return 1;
}
}